

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O1

void __thiscall streams_tests::xor_file::test_method(xor_file *this)

{
  shared_count **ppsVar1;
  int iVar2;
  FILE *pFVar3;
  pointer pbVar4;
  AutoFile *pAVar5;
  uchar *puVar6;
  exception *e;
  undefined1 **ppuVar7;
  value_type *__val;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  size_t sVar10;
  ulong uVar11;
  size_t __n;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  bool bVar13;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<std::byte> __l_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> s;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  const_string file_09;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  undefined1 auVar14 [12];
  vector<std::byte,_std::allocator<std::byte>_> read2;
  vector<std::byte,_std::allocator<std::byte>_> read1;
  vector<std::byte,_std::allocator<std::byte>_> xor_pat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test1;
  uint8_t obj;
  uint8_t obj_1;
  uint8_t obj_2;
  AutoFile xor_file_2;
  path xor_path;
  AutoFile xor_file;
  char *in_stack_fffffffffffff9d0;
  char *pcVar15;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  vector<std::byte,_std::allocator<std::byte>_> local_428;
  vector<std::byte,_std::allocator<std::byte>_> local_408 [3];
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  lazy_ostream local_240;
  pointer local_230;
  char *local_228;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  vector<std::byte,_std::allocator<std::byte>_> local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  undefined1 local_162;
  undefined1 local_161;
  vector<std::byte,_std::allocator<std::byte>_> local_160;
  undefined1 local_148 [8];
  assertion_result local_140;
  string local_128;
  string local_108;
  AutoFile local_e8;
  path local_c8;
  path local_a0;
  assertion_result local_78;
  vector<std::byte,_std::allocator<std::byte>_> *local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_c8,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_c8,0xc,"test_xor.bin");
  std::filesystem::__cxx11::path::path(&local_a0,&local_c8);
  std::filesystem::__cxx11::path::~path(&local_c8);
  local_58._0_3_ = 0x30201;
  __l._M_len = 3;
  __l._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_180,__l,(allocator_type *)&local_78);
  local_58._0_2_ = 0x504;
  __l_00._M_len = 2;
  __l_00._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_198,__l_00,(allocator_type *)&local_78);
  local_58._0_2_ = 0xff;
  __l_01._M_len = 2;
  __l_01._M_array = local_58;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&local_1b0,__l_01,(allocator_type *)&local_78);
  pFVar3 = fsbridge::fopen((char *)&local_a0,"rb");
  puVar12 = local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish +
            -(long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (puVar12 == (pointer)0x0) {
    local_58._8_8_ = (pointer)0x0;
LAB_00648ff5:
    sVar10 = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar10 != 0) {
      memmove((void *)local_58._8_8_,
              local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start,sVar10);
    }
    local_48 = (undefined1 *)(local_58._8_8_ + sVar10);
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_1b8 = "";
    ppuVar7 = &local_1d0;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1b;
    file.m_begin = (iterator)&local_1c0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    local_58._0_8_ = pFVar3;
    local_40 = (char *)(local_58._8_8_ + (long)puVar12);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar7,msg);
    local_162 = 0;
    AutoFile::write((AutoFile *)local_58,(int)&local_162,(void *)0x1,(size_t)ppuVar7);
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1b;
    file_00.m_begin = (iterator)&local_1e0;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f0,
               msg_00);
    local_e8.m_file = (FILE *)((ulong)local_e8.m_file & 0xffffffffffffff00);
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_60 = (vector<std::byte,_std::allocator<std::byte>_> *)0xe80289;
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_1f8 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)&local_78,1,1,WARN,
               (check_type)in_stack_fffffffffffff9d0,(size_t)&local_200,0x1b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish);
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_258 = "";
    ppuVar7 = &local_270;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x1c;
    file_01.m_begin = (iterator)&local_260;
    msg_01.m_end = pvVar9;
    msg_01.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar7,msg_01
              );
    AutoFile::read((AutoFile *)local_58,(int)&local_161,(void *)0x1,(size_t)ppuVar7);
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x1c;
    file_02.m_begin = (iterator)&local_280;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
               msg_02);
    local_e8.m_file = (FILE *)((ulong)local_e8.m_file & 0xffffffffffffff00);
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_60 = (vector<std::byte,_std::allocator<std::byte>_> *)0xe80289;
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_298 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)&local_78,1,1,WARN,
               (check_type)in_stack_fffffffffffff9d0,(size_t)&local_2a0,0x1c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish);
    local_2e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_2d8 = "";
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x1d;
    file_03.m_begin = (iterator)&local_2e0;
    msg_03.m_end = pvVar9;
    msg_03.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
               msg_03);
    AutoFile::ignore((AutoFile *)local_58,1);
    local_300 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_2f8 = "";
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x1d;
    file_04.m_begin = (iterator)&local_300;
    msg_04.m_end = pvVar9;
    msg_04.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_310,
               msg_04);
    local_e8.m_file = (FILE *)((ulong)local_e8.m_file & 0xffffffffffffff00);
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_60 = (vector<std::byte,_std::allocator<std::byte>_> *)0xe80289;
    local_320 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_318 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    sVar10 = 0x1d;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)&local_78,1,1,WARN,
               (check_type)in_stack_fffffffffffff9d0,(size_t)&local_320,0x1d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish);
    AutoFile::~AutoFile((AutoFile *)local_58);
    pFVar3 = fsbridge::fopen((char *)&local_a0,"wbx");
    puVar12 = local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
    if (puVar12 == (pointer)0x0) {
      pbVar4 = (pointer)0x0;
    }
    else {
      if ((long)puVar12 < 0) goto LAB_0064a327;
      pbVar4 = (pointer)operator_new((ulong)puVar12);
    }
    __n = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (__n != 0) {
      memmove(pbVar4,local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
    }
    local_48 = pbVar4 + __n;
    local_58._0_8_ = pFVar3;
    local_58._8_8_ = pbVar4;
    local_40 = (char *)(pbVar4 + (long)puVar12);
    pAVar5 = AutoFile::operator<<((AutoFile *)local_58,&local_180);
    AutoFile::operator<<(pAVar5,&local_198);
    AutoFile::~AutoFile((AutoFile *)local_58);
    local_e8.m_file = (FILE *)fsbridge::fopen((char *)&local_a0,"rb");
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar6 = (uchar *)operator_new(7);
    puVar6[3] = '\0';
    puVar6[4] = '\0';
    puVar6[5] = '\0';
    puVar6[6] = '\0';
    puVar6[0] = '\0';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    AutoFile::read(&local_e8,(int)puVar6,(void *)0x7,sVar10);
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x2e;
    file_05.m_begin = (iterator)&local_360;
    msg_05.m_end = in_R9;
    msg_05.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_370,
               msg_05);
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    puVar12 = boost::unit_test::lazy_ostream::inst;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    s.m_size = 7;
    s.m_data = puVar6;
    HexStr_abi_cxx11_(&local_108,s);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_108,"fc01fd03fd04fa");
    local_128._M_dataplus._M_p._0_1_ = iVar2 == 0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_140._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_140.m_message.px = (element_type *)0xf6aef5;
    local_40 = (char *)local_408;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_60 = &local_428;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xf6b17a;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3e30;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    in_stack_fffffffffffff9d0 = "HexStr(raw)";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_108;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_128,&local_240,1,2,REQUIRE,0xf6b16e,(size_t)&local_140,
               0x2e,local_58,"\"fc01fd03fd04fa\"",&local_78);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_128.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_378 = "";
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x30;
    file_06.m_begin = (iterator)&local_380;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_390,
               msg_06);
    AutoFile::ignore(&local_e8,1);
    local_3a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_398 = "";
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x30;
    file_07.m_begin = (iterator)&local_3a0;
    msg_07.m_end = pvVar9;
    msg_07.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3b0,
               msg_07);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = "exception std::ios_base::failure expected but not raised";
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_3b8 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff9d0,
               (size_t)&local_3c0,0x30);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    operator_delete(puVar6,7);
    AutoFile::~AutoFile(&local_e8);
    pFVar3 = fsbridge::fopen((char *)&local_a0,"rb");
    uVar11 = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar11 == 0) {
      pbVar4 = (pointer)0x0;
    }
    else {
      if ((long)uVar11 < 0) goto LAB_0064a343;
      pbVar4 = (pointer)operator_new(uVar11);
    }
    sVar10 = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar10 != 0) {
      memmove(pbVar4,local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar4 + sVar10;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_file = (FILE *)pFVar3;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = pbVar4;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pbVar4 + uVar11;
    pAVar5 = AutoFile::operator>>(&local_e8,local_408);
    AutoFile::operator>>(pAVar5,&local_428);
    local_438 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x36;
    file_08.m_begin = (iterator)&local_438;
    msg_08.m_end = in_R9;
    msg_08.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_448,
               msg_08);
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    s_00.m_size = (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_00.m_data = local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_00);
    s_01.m_size = (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_01.m_data = local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_128,s_01);
    if (local_108._M_string_length == local_128._M_string_length) {
      if (local_108._M_string_length == 0) {
        bVar13 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),local_108._M_string_length);
        bVar13 = iVar2 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar13;
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf6ae96;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xf6aef5;
    local_40 = local_148;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_128;
    local_148 = (undefined1  [8])&local_108;
    local_60 = &local_160;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,&local_240,1,2,REQUIRE,0xf6b251,
               (size_t)&local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish,0x36,local_58,"HexStr(test1)",&local_78);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_)
                      ,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    local_458 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_450 = "";
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    local_460 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x37;
    file_09.m_begin = (iterator)&local_458;
    msg_09.m_end = pvVar9;
    msg_09.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_468,
               msg_09);
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    s_02.m_size = (long)local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_02.m_data = local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_02);
    s_03.m_size = (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_03.m_data = local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_128,s_03);
    if (local_108._M_string_length == local_128._M_string_length) {
      if (local_108._M_string_length == 0) {
        bVar13 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),local_108._M_string_length);
        bVar13 = iVar2 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar13;
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf6ae96;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xf6aef5;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = local_148;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    in_stack_fffffffffffff9d0 = "HexStr(read2)";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_128;
    local_148 = (undefined1  [8])&local_108;
    local_60 = &local_160;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,&local_240,1,2,REQUIRE,0xf6b26d,
               (size_t)&local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish,0x37,local_58,"HexStr(test2)",&local_78);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_)
                      ,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    local_478 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_470 = "";
    ppuVar7 = &local_488;
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x39;
    file_10.m_begin = (iterator)&local_478;
    msg_10.m_end = pvVar9;
    msg_10.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar7,msg_10
              );
    AutoFile::read(&local_e8,(int)&local_160,(void *)0x1,(size_t)ppuVar7);
    local_498 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_490 = "";
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x39;
    file_11.m_begin = (iterator)&local_498;
    msg_11.m_end = pvVar9;
    msg_11.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4a8,
               msg_11);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = "exception std::ios_base::failure expected but not raised";
    local_4b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_4b0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff9d0,
               (size_t)&local_4b8,0x39);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    if (local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((string *)
        local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    AutoFile::~AutoFile(&local_e8);
    pFVar3 = fsbridge::fopen((char *)&local_a0,"rb");
    uVar11 = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar11 == 0) {
      pbVar4 = (pointer)0x0;
    }
    else {
      if ((long)uVar11 < 0) goto LAB_0064a35f;
      pbVar4 = (pointer)operator_new(uVar11);
    }
    sVar10 = (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar10 != 0) {
      memmove(pbVar4,local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar10);
    }
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar4 + sVar10;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.m_file = (FILE *)pFVar3;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = pbVar4;
    local_e8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pbVar4 + uVar11;
    AutoFile::ignore(&local_e8,4);
    AutoFile::operator>>(&local_e8,local_408);
    local_4f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_4f0 = "";
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    local_500 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x41;
    file_12.m_begin = (iterator)&local_4f8;
    msg_12.m_end = in_R9;
    msg_12.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_508,
               msg_12);
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_230 = boost::unit_test::lazy_ostream::inst;
    local_228 = "";
    s_04.m_size = (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_04.m_data = local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_04);
    s_05.m_size = (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_05.m_data = local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_128,s_05);
    if (local_108._M_string_length == local_128._M_string_length) {
      if (local_108._M_string_length == 0) {
        bVar13 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),local_108._M_string_length);
        bVar13 = iVar2 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar13;
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xf6ae96;
    local_428.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf6aef5;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = (char *)&local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_60 = (vector<std::byte,_std::allocator<std::byte>_> *)local_148;
    pcVar15 = "HexStr(read2)";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    local_160.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_108;
    local_148 = (undefined1  [8])&local_128;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,&local_240,1,2,REQUIRE,0xf6b26d,(size_t)&local_428,0x41,local_58,
               "HexStr(test2)",&local_78);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_)
                      ,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    local_518 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_510 = "";
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_520 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x43;
    file_13.m_begin = (iterator)&local_518;
    msg_13.m_end = pvVar9;
    msg_13.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_528,
               msg_13);
    AutoFile::ignore(&local_e8,1);
    local_538 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_530 = "";
    local_548 = &boost::unit_test::basic_cstring<char_const>::null;
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x43;
    file_14.m_begin = (iterator)&local_538;
    msg_14.m_end = pvVar9;
    msg_14.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_548,
               msg_14);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = "exception std::ios_base::failure expected but not raised";
    local_558 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_550 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar15,(size_t)&local_558,
               0x43);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    local_598 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_590 = "";
    ppuVar7 = &local_5a8;
    local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x44;
    file_15.m_begin = (iterator)&local_598;
    msg_15.m_end = pvVar9;
    msg_15.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)ppuVar7,msg_15
              );
    AutoFile::read(&local_e8,(int)&local_128,(void *)0x1,(size_t)ppuVar7);
    local_5b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5b0 = "";
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x44;
    file_16.m_begin = (iterator)&local_5b8;
    msg_16.m_end = pvVar9;
    msg_16.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5c8,
               msg_16);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3ef0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = "exception std::ios_base::failure expected but not raised";
    local_5d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5d0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar15,(size_t)&local_5d8,
               0x44);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  }
  else {
    if (-1 < (long)puVar12) {
      local_58._8_8_ = operator_new((ulong)puVar12);
      goto LAB_00648ff5;
    }
    if (*(char **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064b5ab;
    std::__throw_bad_alloc();
LAB_0064a327:
    if (*(char **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064b5ab;
    std::__throw_bad_alloc();
LAB_0064a343:
    if (*(char **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064b5ab;
    std::__throw_bad_alloc();
LAB_0064a35f:
    if (*(char **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064b5ab;
    auVar14 = std::__throw_bad_alloc();
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    if (auVar14._8_4_ != 1) {
      if ((string *)
          local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (string *)0x0) {
        operator_delete(local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      AutoFile::~AutoFile(&local_e8);
      if (local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_198.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::filesystem::__cxx11::path::~path(&local_a0);
      if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(auVar14._0_8_);
      }
      goto LAB_0064b5ab;
    }
    e = (exception *)__cxa_begin_catch(auVar14._0_8_);
    local_5e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x44;
    file_17.m_begin = (iterator)&local_5e8;
    msg_17.m_end = in_R9;
    msg_17.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5f8,
               msg_17);
    ppsVar1 = (shared_count **)&local_78.m_message.pn;
    local_78._0_8_ = ppsVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"AutoFile::read: end of file","");
    local_58._0_8_ = (FILE *)&stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_78._0_8_,
               (long)(sp_counted_base **)local_78._0_8_ +
               (long)&((local_78.m_message.px)->m_stream).
                      super_basic_ostream<char,_std::char_traits<char>_>);
    local_108._M_dataplus._M_p._0_1_ = HasReason::operator()((HasReason *)local_58,e);
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_240.m_empty = false;
    local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d6878;
    local_228 = 
    "exception \"std::ios_base::failure\" raised as expected: validation on the raised exception through predicate \"HasReason{\"AutoFile::read: end of file\"}\""
    ;
    local_608 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_600 = "";
    local_230 = puVar12;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_108,&local_240,1,1,WARN,
               (check_type)in_stack_fffffffffffff9d0,(size_t)&local_608,0x44);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_108.field_2._M_allocated_capacity);
    if ((FILE *)local_58._0_8_ != (FILE *)&stack0xffffffffffffffb8) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)local_48 + 1));
    }
    if ((shared_count **)local_78._0_8_ != ppsVar1) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(local_78.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
    }
    __cxa_end_catch();
  }
  if ((string *)
      local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408[0].super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  AutoFile::~AutoFile(&local_e8);
  if (local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0064b5ab:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xor_file)
{
    fs::path xor_path{m_args.GetDataDirBase() / "test_xor.bin"};
    auto raw_file{[&](const auto& mode) { return fsbridge::fopen(xor_path, mode); }};
    const std::vector<uint8_t> test1{1, 2, 3};
    const std::vector<uint8_t> test2{4, 5};
    const std::vector<std::byte> xor_pat{std::byte{0xff}, std::byte{0x00}};
    {
        // Check errors for missing file
        AutoFile xor_file{raw_file("rb"), xor_pat};
        BOOST_CHECK_EXCEPTION(xor_file << std::byte{}, std::ios_base::failure, HasReason{"AutoFile::write: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: file handle is nullpt"});
    }
    {
#ifdef __MINGW64__
        // Temporary workaround for https://github.com/bitcoin/bitcoin/issues/30210
        const char* mode = "wb";
#else
        const char* mode = "wbx";
#endif
        AutoFile xor_file{raw_file(mode), xor_pat};
        xor_file << test1 << test2;
    }
    {
        // Read raw from disk
        AutoFile non_xor_file{raw_file("rb")};
        std::vector<std::byte> raw(7);
        non_xor_file >> Span{raw};
        BOOST_CHECK_EQUAL(HexStr(raw), "fc01fd03fd04fa");
        // Check that no padding exists
        BOOST_CHECK_EXCEPTION(non_xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read1, read2;
        xor_file >> read1 >> read2;
        BOOST_CHECK_EQUAL(HexStr(read1), HexStr(test1));
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that eof was reached
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read2;
        // Check that ignore works
        xor_file.ignore(4);
        xor_file >> read2;
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that ignore and read fail now
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
}